

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQUnsignedInteger *pSVar1;
  SQClass *pSVar2;
  SQUnsignedInteger SVar3;
  SQObjectPtr *this_00;
  SQUnsignedInteger SVar4;
  bool bVar5;
  
  pSVar2 = this->_class;
  SVar3 = (pSVar2->_defaultvalues)._size;
  pSVar1 = &(pSVar2->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 - 1;
  if (*pSVar1 == 0) {
    (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
  }
  this->_class = (SQClass *)0x0;
  this_00 = this->_values;
  SVar4 = 0;
  if (0 < (long)SVar3) {
    SVar4 = SVar3;
  }
  while (bVar5 = SVar4 != 0, SVar4 = SVar4 - 1, bVar5) {
    SQObjectPtr::Null(this_00);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}